

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

char32_t * Corrade::Containers::ArrayMallocAllocator<char32_t>::allocate(size_t capacity)

{
  ostream *output;
  Debug *pDVar1;
  Flags local_49;
  Error local_48;
  undefined8 *local_20;
  char *memory;
  size_t inBytes;
  size_t capacity_local;
  
  memory = (char *)(capacity * 4 + 8);
  inBytes = capacity;
  local_20 = (undefined8 *)malloc((size_t)memory);
  if (local_20 == (undefined8 *)0x0) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_49);
    Utility::Error::Error(&local_48,output,local_49);
    pDVar1 = Utility::Debug::operator<<
                       (&local_48.super_Debug,"Containers::ArrayMallocAllocator: can\'t allocate");
    pDVar1 = Utility::Debug::operator<<(pDVar1,(unsigned_long)memory);
    Utility::Debug::operator<<(pDVar1,"bytes");
    Utility::Error::~Error(&local_48);
    abort();
  }
  *local_20 = memory;
  return (char32_t *)(local_20 + 1);
}

Assistant:

static T* allocate(std::size_t capacity) {
        /* Compared to ArrayNewAllocator, here the capacity is stored in bytes
           so it's possible to "reinterpret" the array into a different type
           (as the deleter is a typeless std::free() in any case) */
        const std::size_t inBytes = capacity*sizeof(T) + AllocationOffset;
        char* const memory = static_cast<char*>(std::malloc(inBytes));
        CORRADE_ASSERT(memory,
            "Containers::ArrayMallocAllocator: can't allocate" << inBytes << "bytes", {});
        reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
        return reinterpret_cast<T*>(memory + AllocationOffset);
    }